

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinargs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer poVar1;
  pointer poVar2;
  pointer ppcVar3;
  ostream *poVar4;
  option_results *poVar5;
  iterator __end1;
  iterator __begin1;
  pointer ppcVar6;
  int iVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  string *psVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<argagg::definition> __l_04;
  allocator local_4d1;
  allocator_type local_4d0;
  allocator local_4cf;
  allocator_type local_4ce;
  allocator local_4cd;
  allocator local_4cc;
  allocator local_4cb;
  allocator local_4ca;
  allocator_type local_4c9;
  allocator local_4c8;
  allocator local_4c7;
  allocator local_4c6;
  allocator local_4c5;
  allocator_type local_4c4;
  allocator local_4c3;
  allocator local_4c2;
  allocator local_4c1;
  allocator_type local_4c0;
  allocator local_4bf;
  allocator local_4be;
  allocator local_4bd;
  allocator local_4bc;
  allocator_type local_4bb;
  allocator local_4ba;
  allocator local_4b9;
  string filename;
  string local_498 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  string local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  parser argparser;
  parser_results args;
  ofstream output_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string local_370 [32];
  uint local_350;
  string local_348 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_310 [32];
  undefined4 local_2f0;
  string local_2e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  string local_2b0 [32];
  undefined4 local_290;
  string local_288 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250 [32];
  undefined4 local_230;
  string local_228 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  string local_1f0 [32];
  undefined4 local_1d0;
  ostringstream usage;
  
  std::__cxx11::string::string((string *)&output_file,"help",&local_4d1);
  std::__cxx11::string::string((string *)&usage,"-h",&local_4b9);
  std::__cxx11::string::string
            ((string *)&usage.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20,"--help"
             ,&local_4ba);
  __l._M_len = 2;
  __l._M_array = (iterator)&usage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_388,__l,&local_4bb);
  std::__cxx11::string::string(local_370,"displays help information",&local_4bc);
  local_350 = 0;
  std::__cxx11::string::string(local_348,"verbose",&local_4bd);
  std::__cxx11::string::string((string *)&args,"-v",&local_4be);
  std::__cxx11::string::string((string *)&args.options._M_h._M_element_count,"--verbose",&local_4bf)
  ;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&args;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_328,__l_00,&local_4c0);
  std::__cxx11::string::string(local_310,"increases verbosity",&local_4c1);
  local_2f0 = 0;
  std::__cxx11::string::string(local_2e8,"lorem-ipsum",&local_4c2);
  std::__cxx11::string::string((string *)&local_438,"--lorem-ipsum",&local_4c3);
  __l_01._M_len = 1;
  __l_01._M_array = &local_438;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c8,__l_01,&local_4c4);
  std::__cxx11::string::string
            (local_2b0,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut aliquip ex ea commodo consequat. Duis aute irure dolor in reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla pariatur. Excepteur sint occaecat cupidatat non proident, sunt in culpa qui officia deserunt mollit anim id est laborum."
             ,&local_4c5);
  local_290 = 0;
  std::__cxx11::string::string(local_288,"sep",&local_4c6);
  std::__cxx11::string::string((string *)&sep,"-s",&local_4c7);
  std::__cxx11::string::string(local_458,"--sep",&local_4c8);
  __l_02._M_len = 2;
  __l_02._M_array = &sep;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,__l_02,&local_4c9);
  std::__cxx11::string::string(local_250,"separator (default \',\')",&local_4ca);
  local_230 = 1;
  std::__cxx11::string::string(local_228,"output",&local_4cb);
  std::__cxx11::string::string((string *)&filename,"-o",&local_4cc);
  std::__cxx11::string::string(local_498,"--output",&local_4cd);
  __l_03._M_len = 2;
  __l_03._M_array = &filename;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_208,__l_03,&local_4ce);
  std::__cxx11::string::string(local_1f0,"output filename (stdout if not specified)",&local_4cf);
  local_1d0 = 1;
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)&output_file;
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::vector
            (&argparser.definitions,__l_04,&local_4d0);
  lVar9 = 0x180;
  do {
    argagg::definition::~definition((definition *)(&output_file + lVar9));
    lVar9 = lVar9 + -0x60;
  } while (lVar9 != -0x60);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string(local_498 + lVar9 + -0x20);
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string(local_458 + lVar9 + -0x20);
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  std::__cxx11::string::~string((string *)&local_438);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&args.program + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&usage.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&usage);
  poVar4 = std::operator<<(&usage.super_basic_ostream<char,_std::char_traits<char>_>,
                           "Joins all positional arguments together with a separator\n");
  poVar4 = std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(poVar4,"Usage: ");
  poVar4 = std::operator<<(poVar4,*argv);
  poVar4 = std::operator<<(poVar4," [options] ARG [ARG...]\n");
  std::operator<<(poVar4,'\n');
  args.options._M_h._M_buckets = &args.options._M_h._M_single_bucket;
  args.options._M_h._M_bucket_count = 1;
  args.options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  args.options._M_h._M_element_count = 0;
  args.options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  args.options._M_h._M_rehash_policy._M_next_resize = 0;
  args.options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argagg::parser::parse((parser_results *)&output_file,&argparser,argc,argv);
  argagg::parser_results::operator=(&args,(parser_results *)&output_file);
  argagg::parser_results::~parser_results((parser_results *)&output_file);
  std::__cxx11::string::string((string *)&output_file,"help",(allocator *)&sep);
  poVar5 = argagg::parser_results::operator[](&args,(string *)&output_file);
  poVar1 = (poVar5->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  poVar2 = (poVar5->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_start;
  std::__cxx11::string::~string((string *)&output_file);
  if (poVar1 == poVar2) {
    std::__cxx11::string::string((string *)&output_file,"verbose",(allocator *)&sep);
    poVar5 = argagg::parser_results::operator[](&args,(string *)&output_file);
    poVar1 = (poVar5->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar5->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&output_file);
    puVar10 = g_dev_null;
    std::ofstream::open(g_dev_null,0x110313);
    iVar7 = (int)((ulong)((long)poVar1 - (long)poVar2) >> 3);
    if (0 < iVar7) {
      puVar10 = (undefined1 *)&std::cerr;
    }
    poVar4 = std::operator<<((ostream *)puVar10,"verbose log level: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::string((string *)&output_file,"sep",(allocator *)&local_438);
    poVar5 = argagg::parser_results::operator[](&args,(string *)&output_file);
    std::__cxx11::string::string((string *)&filename,",",&local_4d1);
    argagg::option_results::as<std::__cxx11::string>(&sep,poVar5,&filename);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&output_file);
    poVar4 = std::operator<<((ostream *)puVar10,"set separator to \'");
    poVar4 = std::operator<<(poVar4,(string *)&sep);
    std::operator<<(poVar4,"\'\n");
    std::ofstream::ofstream(&output_file);
    std::__cxx11::string::string((string *)&filename,"output",(allocator *)&local_438);
    poVar5 = argagg::parser_results::operator[](&args,&filename);
    poVar1 = (poVar5->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar5->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&filename);
    if (poVar1 == poVar2) {
      std::operator<<((ostream *)puVar10,"outputting to stdout\n");
      psVar12 = (string *)&std::cout;
    }
    else {
      std::__cxx11::string::string((string *)&local_438,"output",&local_4d1);
      poVar5 = argagg::parser_results::operator[](&args,&local_438);
      argagg::option_results::as<std::__cxx11::string>(&filename,poVar5);
      std::__cxx11::string::~string((string *)&local_438);
      psVar12 = (string *)&output_file;
      std::ofstream::open(psVar12,(_Ios_Openmode)&filename);
      poVar4 = std::operator<<((ostream *)puVar10,"outputting to file at \'");
      poVar4 = std::operator<<(poVar4,(string *)&filename);
      std::operator<<(poVar4,"\'\n");
      std::__cxx11::string::~string((string *)&filename);
    }
    ppcVar3 = args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__cxx11::stringbuf::str();
      if (iVar7 < 0) {
        puVar10 = g_dev_null;
      }
      else {
        puVar10 = (undefined1 *)&std::cerr;
      }
      poVar4 = std::operator<<((ostream *)puVar10,(string *)&filename);
      poVar4 = operator<<(poVar4,&argparser);
      poVar4 = std::operator<<(poVar4,'\n');
      std::operator<<(poVar4,"Not enough arguments\n");
      std::__cxx11::string::~string((string *)&filename);
      iVar7 = 1;
    }
    else {
      puVar10 = (undefined1 *)&std::cerr;
      puVar8 = (undefined1 *)&std::cerr;
      if (iVar7 < 2) {
        puVar8 = g_dev_null;
      }
      puVar11 = (undefined1 *)&std::cerr;
      if (iVar7 < 4) {
        puVar11 = g_dev_null;
      }
      ppcVar6 = args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (iVar7 < 3) {
        puVar10 = g_dev_null;
      }
      for (; ppcVar6 != ppcVar3; ppcVar6 = ppcVar6 + 1) {
        std::operator<<((ostream *)puVar8,"writing argument\n");
        poVar4 = std::operator<<((ostream *)puVar11,"argument is \'");
        poVar4 = std::operator<<(poVar4,*ppcVar6);
        std::operator<<(poVar4,"\'\n");
        std::operator<<((ostream *)psVar12,*ppcVar6);
        if (*ppcVar6 !=
            args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]) {
          std::operator<<((ostream *)puVar10,"writing separator\n");
          std::operator<<((ostream *)psVar12,(string *)&sep);
        }
      }
      std::operator<<((ostream *)puVar11,"writing endl\b");
      std::operator<<((ostream *)psVar12,'\n');
      iVar7 = 0;
      std::operator<<((ostream *)puVar11,"everything a-okay\n");
    }
    std::ofstream::~ofstream(&output_file);
    std::__cxx11::string::~string((string *)&sep);
  }
  else {
    argagg::fmt_ostream::fmt_ostream((fmt_ostream *)&output_file,(ostream *)&std::cerr);
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&output_file,(string *)&sep);
    operator<<(poVar4,&argparser);
    std::__cxx11::string::~string((string *)&sep);
    argagg::fmt_ostream::~fmt_ostream((fmt_ostream *)&output_file);
    iVar7 = 0;
  }
  argagg::parser_results::~parser_results(&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usage);
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::~vector
            (&argparser.definitions);
  return iVar7;
}

Assistant:

int main(
  int argc,
  const char** argv)
{
  using argagg::parser_results;
  using argagg::parser;
  using std::cerr;
  using std::cout;
  using std::ofstream;
  using std::ostream;
  using std::ostringstream;
  using std::string;

  // Use an initializer list to define the argument parser. The first brace
  // starts the initializer list, the second brace starts the initializer list
  // for the definitions vector in the argagg::parser struct.
  parser argparser {{

      // Each entry here is an initializer list for an `argagg::definition`
      // struct.
      {
        // Name of the option. This is the key used to retrieve the flag parser
        // results.
        "help",

        // The strings ("flags") that must be matched to activate this option.
        {"-h", "--help"},

        // The help string that is streamed out when the argagg::parser object
        // itself is streamed out.
        "displays help information",

        // Number of arguments needed by this option. Should be 0 or 1.
        0},
      {
        "verbose", {"-v", "--verbose"},
        "increases verbosity", 0},
      {
        "lorem-ipsum", {"--lorem-ipsum"},
        "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do "
        "eiusmod tempor incididunt ut labore et dolore magna aliqua. Ut enim "
        "ad minim veniam, quis nostrud exercitation ullamco laboris nisi ut "
        "aliquip ex ea commodo consequat. Duis aute irure dolor in "
        "reprehenderit in voluptate velit esse cillum dolore eu fugiat nulla "
        "pariatur. Excepteur sint occaecat cupidatat non proident, sunt in "
        "culpa qui officia deserunt mollit anim id est laborum.", 0},
      {
        "sep", {"-s", "--sep"},
        "separator (default ',')", 1},
      {
        "output", {"-o", "--output"},
        "output filename (stdout if not specified)", 1},
    }};

  // Define our usage text.
  ostringstream usage;
  usage
    << "Joins all positional arguments together with a separator\n"
    << '\n'
    << "Usage: " << argv[0] << " [options] ARG [ARG...]\n"
    << '\n';

  // Use our argument parser to... parse the command line arguments. If there
  // are any problems then just spit out the usage and help text and exit.
  argagg::parser_results args;
  try {
    args = argparser.parse(argc, argv);
  } catch (const std::exception& e) {
    argagg::fmt_ostream help(cerr);
    help << usage.str() << argparser << '\n'
         << "Encountered exception while parsing arguments: " << e.what()
         << '\n';
    return EXIT_FAILURE;
  }

  // If the help flag was specified then spit out the usage and help text and
  // exit.
  if (args["help"]) {
    argagg::fmt_ostream help(cerr);
    help << usage.str() << argparser;
    return EXIT_SUCCESS;
  }

  // Respect verbosity. Okay, the logging here is a little ludicrous. The point
  // I want to show here is that you can quickly get the number of times an
  // option shows up.
  int verbose_level = args["verbose"].count();

  // Set up our verbose log output stream selector that selects stderr if the
  // requested log level is lower than or equal to the currently set verbose
  // level.
  g_dev_null.open("/dev/null"); // portable? eh... simple? yes!
  auto vlog = [&](int level) -> ostream& {
      return verbose_level >= level ? cerr : g_dev_null;
    };

  vlog(1) << "verbose log level: " << verbose_level << '\n';

  // Use comma as the separator unless one was specified.
  auto sep = args["sep"].as<string>(",");
  vlog(1) << "set separator to '" << sep << "'\n";

  // Determine output stream.
  ofstream output_file;
  ostream* output = &std::cout;
  if (args["output"]) {
    string filename = args["output"];
    output_file.open(filename);
    output = &output_file;
    vlog(1) << "outputting to file at '" << filename << "'\n";
  } else {
    vlog(1) << "outputting to stdout\n";
  }

  // Join the arguments.
  if (args.count() < 1) {
    vlog(0) << usage.str() << argparser << '\n'
            << "Not enough arguments\n";
    return EXIT_FAILURE;
  }
  for (auto& arg : args.pos) {
    vlog(2) << "writing argument\n";
    vlog(4) << "argument is '" << arg << "'\n";
    *output << arg;
    if (arg != args.pos.back()) {
      vlog(3) << "writing separator\n";
      *output << sep;
    }
  }
  vlog(4) << "writing endl\b";
  *output << '\n';

  vlog(4) << "everything a-okay\n";
  return EXIT_SUCCESS;
}